

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poisson.cpp
# Opt level: O2

void LoadDensityMap(char *FileName)

{
  ostream *poVar1;
  byte *pbVar2;
  float *pfVar3;
  int y;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  int H;
  int W;
  int local_30;
  int local_2c;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Loading density map ");
  poVar1 = std::operator<<(poVar1,FileName);
  std::endl<char,std::char_traits<char>>(poVar1);
  pbVar2 = LoadBMP(FileName,&local_2c,&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Loaded ( ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," ) ");
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((local_2c == 0x200) && (local_30 == 0x200)) {
    pfVar3 = (float *)operator_new__(0x100000);
    pbVar5 = pbVar2;
    g_DensityMap = pfVar3;
    for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 1) {
      pbVar6 = pbVar5;
      for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 1) {
        pfVar3[lVar7] = (float)*pbVar6 / 255.0;
        pbVar6 = pbVar6 + 3;
      }
      pfVar3 = pfVar3 + 0x200;
      pbVar5 = pbVar5 + 0x600;
    }
    operator_delete__(pbVar2);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: density map should be ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x200);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x200);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(0xff);
}

Assistant:

void LoadDensityMap(const char* FileName) {
  std::cout << "Loading density map " << FileName << std::endl;

  int W, H;
  unsigned char* Data = LoadBMP(FileName, &W, &H);

  std::cout << "Loaded ( " << W << " x " << H << " ) " << std::endl;

  if (W != kImageSize || H != kImageSize) {
    std::cout << "ERROR: density map should be " << kImageSize << " x " << kImageSize << std::endl;

    exit(255);
  }

  g_DensityMap = new float[W * H];

  for (int y = 0; y != H; y++) {
    for (int x = 0; x != W; x++) {
      g_DensityMap[x + y * W] = float(Data[3 * (x + y * W)]) / 255.0f;
    }
  }

  delete[] (Data);
}